

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

edata_t * duckdb_je_arena_extent_alloc_large
                    (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  long lVar1;
  _Bool guarded;
  ehooks_t *peVar2;
  edata_t *peVar3;
  ulong uVar4;
  _Bool zero_00;
  size_t size;
  size_t sVar5;
  undefined7 in_register_00000081;
  tsd_t *tsd;
  uint uVar6;
  _Bool deferred_work_generated;
  szind_t local_40;
  undefined4 local_3c;
  undefined1 local_38 [8];
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,zero);
  deferred_work_generated = false;
  if (usize < 0x1001) {
    local_40 = (szind_t)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    local_40 = sz_size2index_compute(usize);
  }
  size = duckdb_je_sz_large_pad + usize;
  peVar2 = duckdb_je_base_ehooks_get(arena->base);
  if (duckdb_je_opt_san_guard_large == 0) {
    guarded = false;
  }
  else {
    guarded = false;
    if ((tsdn != (tsdn_t *)0x0) &&
       (guarded = false,
       (extent_hooks_t *)(peVar2->ptr).repr == &duckdb_je_ehooks_default_extent_hooks)) {
      uVar4 = (tsdn->tsd).
              cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large;
      if (uVar4 < 2) {
        guarded = false;
        if (((0x7000000000000000 < size + 0x2000) || (0x1000 < alignment)) ||
           (sVar5 = duckdb_je_opt_san_guard_large, uVar4 != 1)) goto LAB_01d58f99;
      }
      else {
        sVar5 = uVar4 - 1;
      }
      (tsdn->tsd).
      cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large = sVar5;
      guarded = uVar4 < 2;
    }
  }
LAB_01d58f99:
  zero_00 = (_Bool)(duckdb_je_opt_calloc_madvise_threshold <= usize & (byte)local_3c);
  peVar3 = duckdb_je_pa_alloc(tsdn,&arena->pa_shard,size,alignment,false,local_40,zero_00,guarded,
                              &deferred_work_generated);
  if (peVar3 != (edata_t *)0x0) {
    arena_large_malloc_stats_update(tsdn,arena,usize);
    if ((alignment < 0x1000) && (duckdb_je_sz_large_pad != 0)) {
      uVar6 = (int)alignment + 0x3fU & 0x1fc0;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      if (tsdn == (tsdn_t *)0x0) {
        uVar4 = (long)local_38 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      }
      else {
        uVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar4;
      }
      peVar3->e_addr =
           (void *)((long)peVar3->e_addr +
                   ((uVar4 >> (0x73 - ((byte)lVar1 ^ 0x3f) & 0x3f)) << ((byte)lVar1 & 0x3f)));
    }
    if ((zero_00 == false && (char)local_3c == '\x01') && (-1 < (short)peVar3->e_bits)) {
      switchD_012e5a64::default
                (peVar3->e_addr,0,
                 *(size_t *)
                  ((long)duckdb_je_sz_index2size_tab +
                  (ulong)((uint)(peVar3->e_bits >> 0x11) & 0x7f8)));
    }
  }
  return peVar3;
}

Assistant:

edata_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool zero) {
	bool deferred_work_generated = false;
	szind_t szind = sz_size2index(usize);
	size_t esize = usize + sz_large_pad;

	bool guarded = san_large_extent_decide_guard(tsdn,
	    arena_get_ehooks(arena), esize, alignment);

	/*
	 * - if usize >= opt_calloc_madvise_threshold,
	 *     - pa_alloc(..., zero_override = zero, ...)
	 * - otherwise,
	 *     - pa_alloc(..., zero_override = false, ...)
	 *     - use memset() to zero out memory if zero == true.
	 */
	bool zero_override = zero && (usize >= opt_calloc_madvise_threshold);
	edata_t *edata = pa_alloc(tsdn, &arena->pa_shard, esize, alignment,
	    /* slab */ false, szind, zero_override, guarded,
	    &deferred_work_generated);

	if (edata == NULL) {
		return NULL;
	}

	if (config_stats) {
		arena_large_malloc_stats_update(tsdn, arena, usize);
	}
	if (sz_large_pad != 0) {
		arena_cache_oblivious_randomize(tsdn, arena, edata, alignment);
	}
	/*
	 * This branch should be put after the randomization so that the addr
	 * returned by edata_addr_get() has already be randomized,
	 * if cache_oblivious is enabled.
	 */
	if (zero && !zero_override && !edata_zeroed_get(edata)) {
		void *addr = edata_addr_get(edata);
		size_t usize = edata_usize_get(edata);
		memset(addr, 0, usize);
	}

	return edata;
}